

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JammingTechnique.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::JammingTechnique::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,JammingTechnique *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Kind:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Kind);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Category:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Category);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Subcategory: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Subcategory);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Specific:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Specific);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString JammingTechnique::GetAsString() const
{
    KStringStream ss;

    ss << "Kind:        " << static_cast<KUINT16>(m_ui8Kind)        << endl
       << "Category:    " << static_cast<KUINT16>(m_ui8Category)    << endl
       << "Subcategory: " << static_cast<KUINT16>(m_ui8Subcategory) << endl
       << "Specific:    " << static_cast<KUINT16>(m_ui8Specific)    << endl;

    return ss.str();
}